

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O0

void __thiscall ON_Leader::SetPoints2d(ON_Leader *this,int count,ON_2dPoint *points)

{
  ON_2dPoint *points_local;
  int count_local;
  ON_Leader *this_local;
  
  ON_SimpleArray<ON_2dPoint>::Empty(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
  ON_SimpleArray<ON_2dPoint>::Append
            (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,count,points);
  if (this->m_curve != (ON_NurbsCurve *)0x0) {
    if (this->m_curve != (ON_NurbsCurve *)0x0) {
      (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    }
    this->m_curve = (ON_NurbsCurve *)0x0;
  }
  InvalidateTextPoint(this);
  return;
}

Assistant:

void ON_Leader::SetPoints2d(int count, const ON_2dPoint* points)
{
  m_points.Empty();
  m_points.Append(count, points);
  if (nullptr != m_curve)
  {
    delete m_curve;
    m_curve = nullptr;
  }
  InvalidateTextPoint();
}